

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O1

void __thiscall sjtu::UserManager::~UserManager(UserManager *this)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  ofstream outfile;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  if (this->UserFile != (FileManager<sjtu::userType> *)0x0) {
    (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[5])();
  }
  this_00 = this->UserBpTree;
  if (this_00 != (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0) {
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::~BplusTree(this_00);
    operator_delete(this_00,0x18);
  }
  std::ofstream::ofstream(&local_210,"OnlineFlag.dat",_S_out|_S_bin);
  std::ostream::write((char *)&local_210,(long)&this->online_flag);
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _tellp;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

~UserManager() {
            delete UserFile;
            delete UserBpTree;
            	std::ofstream outfile("OnlineFlag.dat" , std::ios_base::out | std::ios_base::binary);
            	outfile.write(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	outfile.close();
        }